

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createBlockItems
          (Scope *scope,StatementSyntax *syntax,bool labelHandled,
          SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *extraMembers)

{
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar1;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> buffer;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> local_58 [2];
  
  local_58[0].len = 0;
  local_58[0].cap = 5;
  local_58[0].data_ = (pointer)local_58[0].firstElement;
  findBlocks(scope,syntax,local_58,extraMembers,labelHandled);
  sVar1._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::StatementBlockSymbol_*>::copy
                 (local_58,(EVP_PKEY_CTX *)scope->compilation,src);
  sVar1._M_ptr._4_4_ = extraout_var;
  if (local_58[0].data_ != (pointer)local_58[0].firstElement) {
    operator_delete(local_58[0].data_);
  }
  sVar1._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar1;
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createBlockItems(
    const Scope& scope, const StatementSyntax& syntax, bool labelHandled,
    SmallVector<const SyntaxNode*>& extraMembers) {

    SmallVector<const StatementBlockSymbol*> buffer;
    findBlocks(scope, syntax, buffer, extraMembers, labelHandled);
    return buffer.copy(scope.getCompilation());
}